

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QNameDatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::QNameDatatypeValidator::checkContent
          (QNameDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  short *psVar1;
  XMLCh *pXVar2;
  short *psVar3;
  char16_t cVar4;
  char16_t cVar5;
  uint uVar6;
  DatatypeValidator *pDVar7;
  RefArrayVectorOf<char16_t> *pRVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  char16_t *pcVar12;
  char16_t *toDelete;
  undefined4 extraout_var_01;
  InvalidDatatypeValueException *pIVar13;
  char16_t *pcVar14;
  long lVar15;
  ulong getAt;
  ulong uVar16;
  size_t sVar17;
  bool bVar18;
  bool bVar19;
  ArrayJanitor<char16_t> jan;
  ArrayJanitor<char16_t> janEnum;
  char16_t *local_88;
  char16_t *local_70;
  ArrayJanitor<char16_t> local_50;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  
  pDVar7 = (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  if (pDVar7 != (DatatypeValidator *)0x0) {
    (*(pDVar7->super_XSerializable)._vptr_XSerializable[0x14])(pDVar7,content,context,1,manager);
  }
  uVar6 = (this->super_AbstractStringValidator).super_DatatypeValidator.fFacetsDefined;
  if (((uVar6 & 8) != 0) &&
     (bVar9 = RegularExpression::matches
                        ((this->super_AbstractStringValidator).super_DatatypeValidator.fRegex,
                         content,manager), !bVar9)) {
    pIVar13 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeValueException::InvalidDatatypeValueException
              (pIVar13,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
               ,0x6c,VALUE_NotMatch_Pattern,content,
               (this->super_AbstractStringValidator).super_DatatypeValidator.fPattern,(XMLCh *)0x0,
               (XMLCh *)0x0,manager);
    __cxa_throw(pIVar13,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
  }
  if (!asBase) {
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0x11])(this,content,manager);
    uVar16 = 0;
    ArrayJanitor<char16_t>::ArrayJanitor(&local_50,(char16_t *)0x0,manager);
    local_88 = (char16_t *)0x0;
    if (context != (ValidationContext *)0x0) {
      if (content == (XMLCh *)0x0) {
        local_88 = (char16_t *)0x0;
      }
      else {
        sVar17 = 0;
        do {
          psVar1 = (short *)((long)content + sVar17);
          sVar17 = sVar17 + 2;
        } while (*psVar1 != 0);
        iVar10 = (*manager->_vptr_MemoryManager[3])(manager,sVar17);
        local_88 = (char16_t *)CONCAT44(extraout_var,iVar10);
        memcpy(local_88,content,sVar17);
      }
      ArrayJanitor<char16_t>::reset(&local_50,local_88,manager);
      (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
        _vptr_XSerializable[0x16])(this,local_88,manager);
      uVar11 = XMLString::indexOf(content,L':');
      uVar16 = (ulong)uVar11;
      if (0 < (int)uVar11) {
        local_88[uVar16] = L'\0';
        iVar10 = (*context->_vptr_ValidationContext[0xd])(context);
        if ((char)iVar10 != '\0') {
          pIVar13 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeValueException::InvalidDatatypeValueException
                    (pIVar13,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                     ,0x87,VALUE_QName_Invalid2,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar13,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    if (((uVar6 & 0x10) != 0) &&
       (pRVar8 = (this->super_AbstractStringValidator).fEnumeration,
       pRVar8 != (RefArrayVectorOf<char16_t> *)0x0 && context != (ValidationContext *)0x0)) {
      pcVar14 = local_88 + uVar16 + 1;
      if ((int)uVar16 < 1) {
        pcVar14 = local_88;
      }
      uVar16 = (pRVar8->super_BaseRefVectorOf<char16_t>).fCurCount;
      if (uVar16 == 0) {
        getAt = 0;
      }
      else {
        local_70 = (char16_t *)0x0;
        bVar9 = false;
        getAt = 0;
        do {
          pcVar12 = BaseRefVectorOf<char16_t>::elementAt
                              (&((this->super_AbstractStringValidator).fEnumeration)->
                                super_BaseRefVectorOf<char16_t>,getAt);
          if (pcVar12 == (char16_t *)0x0) {
            toDelete = (XMLCh *)0x0;
          }
          else {
            sVar17 = 0;
            do {
              psVar1 = (short *)((long)pcVar12 + sVar17);
              sVar17 = sVar17 + 2;
            } while (*psVar1 != 0);
            iVar10 = (*manager->_vptr_MemoryManager[3])(manager,sVar17);
            toDelete = (char16_t *)CONCAT44(extraout_var_00,iVar10);
            memcpy(toDelete,pcVar12,sVar17);
          }
          ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,manager);
          iVar10 = XMLString::indexOf(toDelete,L':',0,manager);
          if (iVar10 != -1) {
            pXVar2 = toDelete + iVar10;
            toDelete = pXVar2 + 1;
            *pXVar2 = L'\0';
          }
          if (pcVar14 == toDelete) {
LAB_00304e57:
            if (-1 < iVar10) {
              if (!bVar9) {
                iVar10 = (*context->_vptr_ValidationContext[0xf])(context,local_88);
                local_70 = (char16_t *)CONCAT44(extraout_var_01,iVar10);
                bVar9 = true;
              }
              pcVar12 = BaseRefVectorOf<char16_t>::elementAt
                                  (&((this->super_AbstractStringValidator).fEnumeration)->
                                    super_BaseRefVectorOf<char16_t>,getAt | 1);
              if (local_70 != pcVar12) {
                if (pcVar12 != (char16_t *)0x0 && local_70 != (char16_t *)0x0) {
                  lVar15 = 0;
                  do {
                    psVar1 = (short *)((long)local_70 + lVar15);
                    if (*psVar1 == 0) {
                      pcVar12 = (char16_t *)((long)pcVar12 + lVar15);
                      goto LAB_00304ef6;
                    }
                    psVar3 = (short *)((long)pcVar12 + lVar15);
                    lVar15 = lVar15 + 2;
                  } while (*psVar1 == *psVar3);
                  goto LAB_00304ee7;
                }
                if (local_70 == (char16_t *)0x0) {
                  if (pcVar12 == (char16_t *)0x0) goto LAB_00304f00;
                }
                else {
                  bVar19 = *local_70 != L'\0';
                  if ((pcVar12 == (char16_t *)0x0) || (*local_70 != L'\0')) goto LAB_00304f03;
                }
LAB_00304ef6:
                bVar19 = *pcVar12 != L'\0';
                goto LAB_00304f03;
              }
            }
LAB_00304f00:
            bVar19 = false;
          }
          else if ((pcVar14 == (char16_t *)0x0) || (pcVar12 = pcVar14, toDelete == (char16_t *)0x0))
          {
            if (pcVar14 == (char16_t *)0x0) {
              if (toDelete == (char16_t *)0x0) goto LAB_00304e57;
LAB_00304e43:
              bVar18 = *toDelete == L'\0';
            }
            else {
              bVar18 = *pcVar14 == L'\0';
              if ((toDelete != (char16_t *)0x0) && (*pcVar14 == L'\0')) goto LAB_00304e43;
            }
            bVar19 = true;
            if (bVar18) goto LAB_00304e57;
          }
          else {
            do {
              cVar4 = *pcVar12;
              if (cVar4 == L'\0') goto LAB_00304e43;
              pcVar12 = pcVar12 + 1;
              cVar5 = *toDelete;
              toDelete = toDelete + 1;
            } while (cVar4 == cVar5);
LAB_00304ee7:
            bVar19 = true;
          }
LAB_00304f03:
          ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
        } while ((bVar19) && (getAt = getAt + 2, getAt < uVar16));
      }
      if (getAt == uVar16) {
        pIVar13 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar13,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                   ,0xd2,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar13,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
      }
    }
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0xf])(this,content,manager);
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
  }
  return;
}

Assistant:

void QNameDatatypeValidator::checkContent( const XMLCh*             const content
                                          ,       ValidationContext* const context
                                          ,       bool                     asBase
                                          ,       MemoryManager*     const manager
                                          )
{

    //validate against base validator if any
    QNameDatatypeValidator *pBaseValidator = (QNameDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator)
        pBaseValidator->checkContent(content, context, true, manager);

    int thisFacetsDefined = getFacetsDefined();

    // we check pattern first
    if ( (thisFacetsDefined & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    checkValueSpace(content, manager);

    int colonPos = 0;
    XMLCh* prefix = 0;    
    ArrayJanitor<XMLCh>  jan(prefix, manager);

    if (context) {
        prefix = XMLString::replicate(content, manager);
        jan.reset(prefix, manager);
        normalizeContent(prefix, manager);

        colonPos = XMLString::indexOf(content, chColon);
        if (colonPos > 0) {                        
            prefix[colonPos] = chNull;                     
            if (context->isPrefixUnknown(prefix)) {
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_QName_Invalid2
                    , content
                    , manager);             
            }                                  
        }
    }

#if 0
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0))
    {
        XMLCh* normContent = XMLString::replicate(content, manager);
        ArrayJanitor<XMLCh>  jan(normContent, manager);
        normalizeContent(normContent, manager);

        int i=0;
        int enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (XMLString::equals(normContent, getEnumeration()->elementAt(i)))
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }


#else
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0) && context)
    {
        XMLCh* localName;
        if (colonPos > 0) {
            localName = prefix + colonPos + 1;
        }
        else {
            localName = prefix;
        }

        XMLCh* enumPrefix;
        XMLCh* enumLocalName;
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        bool foundURIId = false;
        const XMLCh* normURI = 0;
		// The +=2 is because the enumeration has prefix:localname as one entry followed
		// by the URI string for the prefix as the next entry.
        for ( ; i < enumLength; i+=2)
        {            
            enumPrefix = XMLString::replicate(getEnumeration()->elementAt(i), manager);
            ArrayJanitor<XMLCh>  janEnum(enumPrefix, manager);
            colonPos = XMLString::indexOf(enumPrefix, chColon, 0, manager);
            
            if (colonPos != -1) {
                enumLocalName = enumPrefix + colonPos + 1;
                enumPrefix[colonPos] = chNull;
            }
            else {
                enumLocalName = enumPrefix;
            }
            
            if (XMLString::equals(localName, enumLocalName)) {               
				if (colonPos < 0)
					break;

                // now need to see if the prefix URI's are the same                
                if (!foundURIId) {                    
                    normURI = context->getURIForPrefix(prefix);                                       
                    foundURIId = true;
                }
				if (XMLString::equals(normURI, getEnumeration()->elementAt(i+1)))
					break;
            }        
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }
#endif

    checkAdditionalFacet(content, manager);
}